

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate_Coding_Synchronized_IAF_SNN_Results.cpp
# Opt level: O2

int main(void)

{
  string param;
  
  run();
  return 0;
}

Assistant:

int main() 
{
    try {
        return run();
    }
    catch (int param) { cout << "int exception"; }
    catch (char param) { cout << "char exception"; }
    catch (string param) { cout << "string exception: " + param; }
    catch (...) { cout << "default exception"; }
}